

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
MemChunk::setUsedSize(MemChunk *this,bool storingExactSize,size_type userSize)

{
  size_type sVar1;
  char diff;
  size_type chunkSize;
  size_type userSize_local;
  bool storingExactSize_local;
  MemChunk *this_local;
  
  sVar1 = getChunkSize(this);
  this->m_size = this->m_size | 1;
  if ((storingExactSize) && (userSize + 0x10 != sVar1)) {
    this->m_size = this->m_size | 2;
    *(char *)((long)this + (sVar1 - 1)) = (char)sVar1 - (char)(userSize + 0x10);
  }
  *(size_type *)((long)&this->m_prevFootSize + sVar1) = sVar1 | 1;
  return;
}

Assistant:

inline void
        setUsedSize (bool storingExactSize, size_type userSize)
        {
            size_type chunkSize = getChunkSize ();
            m_size |= BIT_USED;
            if (storingExactSize)
            {
                userSize += CHUNK_OVERHEAD;
                if (userSize != chunkSize)
                {
                    m_size |= BIT_NOTEXACTSIZE;
                    char diff = (char)(chunkSize - userSize);
                    *(((char*)this) + chunkSize - 1) = diff;
                }
            }
            ((MemChunk*)((char*) (this) + (chunkSize)))->m_prevFootSize = chunkSize | BIT_USED;
        }